

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_deserialize_container
          (t_netstd_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  string sStack_188;
  string i;
  string obj;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&obj,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&obj);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&obj);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  obj._M_dataplus._M_p = (pointer)&obj.field_2;
  obj._M_string_length = 0;
  obj.field_2._M_local_buf[0] = '\0';
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string((string *)&local_c8,"_set",(allocator *)&sStack_188);
      t_generator::tmp(&i,(t_generator *)this,&local_c8);
      std::__cxx11::string::operator=((string *)&obj,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      psVar4 = &local_c8;
      goto LAB_0025772c;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string((string *)&local_e8,"_list",(allocator *)&sStack_188);
      t_generator::tmp(&i,(t_generator *)this,&local_e8);
      std::__cxx11::string::operator=((string *)&obj,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      psVar4 = &local_e8;
      goto LAB_0025772c;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"_map",(allocator *)&sStack_188);
    t_generator::tmp(&i,(t_generator *)this,&local_a8);
    std::__cxx11::string::operator=((string *)&obj,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    psVar4 = &local_a8;
LAB_0025772c:
    std::__cxx11::string::~string((string *)psVar4);
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&i,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&i);
      poVar3 = std::operator<<(poVar3,"TSet ");
      poVar3 = std::operator<<(poVar3,(string *)&obj);
      poVar3 = std::operator<<(poVar3," = await iprot.ReadSetBeginAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_002578b8;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&i,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&i);
      poVar3 = std::operator<<(poVar3,"TList ");
      poVar3 = std::operator<<(poVar3,(string *)&obj);
      poVar3 = std::operator<<(poVar3," = await iprot.ReadListBeginAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_002578b8;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&i,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&i);
    poVar3 = std::operator<<(poVar3,"TMap ");
    poVar3 = std::operator<<(poVar3,(string *)&obj);
    poVar3 = std::operator<<(poVar3," = await iprot.ReadMapBeginAsync(");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_002578b8:
    std::__cxx11::string::~string((string *)&i);
  }
  t_generator::indent_abi_cxx11_(&i,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&i);
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3," = new ");
  type_name_abi_cxx11_(&sStack_188,this,ttype,true);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_188);
  poVar3 = std::operator<<(poVar3,"(");
  poVar3 = std::operator<<(poVar3,(string *)&obj);
  poVar3 = std::operator<<(poVar3,".Count);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string((string *)&local_108,"_i",(allocator *)&sStack_188);
  t_generator::tmp(&i,(t_generator *)this,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  t_generator::indent_abi_cxx11_(&sStack_188,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&sStack_188);
  poVar3 = std::operator<<(poVar3,"for(int ");
  poVar3 = std::operator<<(poVar3,(string *)&i);
  poVar3 = std::operator<<(poVar3," = 0; ");
  poVar3 = std::operator<<(poVar3,(string *)&i);
  poVar3 = std::operator<<(poVar3," < ");
  poVar3 = std::operator<<(poVar3,(string *)&obj);
  poVar3 = std::operator<<(poVar3,".Count; ++");
  poVar3 = std::operator<<(poVar3,(string *)&i);
  poVar3 = std::operator<<(poVar3,")");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&sStack_188);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      psVar4 = &local_68;
      std::__cxx11::string::string((string *)psVar4,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,psVar4);
      goto LAB_00257b2c;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      psVar4 = &local_88;
      std::__cxx11::string::string((string *)psVar4,(string *)prefix);
      generate_deserialize_list_element(this,out,(t_list *)ttype,psVar4);
      goto LAB_00257b2c;
    }
  }
  else {
    psVar4 = &local_48;
    std::__cxx11::string::string((string *)psVar4,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,psVar4);
LAB_00257b2c:
    std::__cxx11::string::~string((string *)psVar4);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&sStack_188,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&sStack_188);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_188);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_00257ca6;
      t_generator::indent_abi_cxx11_(&sStack_188,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&sStack_188);
      poVar3 = std::operator<<(poVar3,"await iprot.ReadListEndAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&sStack_188,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&sStack_188);
      poVar3 = std::operator<<(poVar3,"await iprot.ReadSetEndAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&sStack_188,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&sStack_188);
    poVar3 = std::operator<<(poVar3,"await iprot.ReadMapEndAsync(");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&sStack_188);
LAB_00257ca6:
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&sStack_188,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&sStack_188);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)&obj);
  return;
}

Assistant:

void t_netstd_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix)
{
    out << indent() << "{" << endl;
    indent_up();

    string obj;

    if (ttype->is_map())
    {
        obj = tmp("_map");
    }
    else if (ttype->is_set())
    {
        obj = tmp("_set");
    }
    else if (ttype->is_list())
    {
        obj = tmp("_list");
    }

    if (ttype->is_map())
    {
        out << indent() << "TMap " << obj << " = await iprot.ReadMapBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "TSet " << obj << " = await iprot.ReadSetBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "TList " << obj << " = await iprot.ReadListBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    out << indent() << prefix << " = new " << type_name(ttype) << "(" << obj << ".Count);" << endl;
    string i = tmp("_i");
    out << indent() << "for(int " << i << " = 0; " << i << " < " << obj << ".Count; ++" << i << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        generate_deserialize_map_element(out, static_cast<t_map*>(ttype), prefix);
    }
    else if (ttype->is_set())
    {
        generate_deserialize_set_element(out, static_cast<t_set*>(ttype), prefix);
    }
    else if (ttype->is_list())
    {
        generate_deserialize_list_element(out, static_cast<t_list*>(ttype), prefix);
    }

    indent_down();
    out << indent() << "}" << endl;

    if (ttype->is_map())
    {
        out << indent() << "await iprot.ReadMapEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await iprot.ReadSetEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await iprot.ReadListEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl;
}